

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void decode_rcpw_insert(DisasContext_conflict14 *ctx)

{
  uint uVar1;
  TCGContext_conflict9 *tcg_ctx_00;
  TCGContext_conflict9 *pTVar2;
  uint uVar3;
  TCGv_i32 pTVar4;
  TCGv_i32 pTVar5;
  ulong uVar6;
  TCGContext_conflict9 *tcg_ctx;
  uint val;
  uint len;
  uintptr_t o_3;
  uintptr_t o;
  uint ofs;
  uintptr_t o_2;
  uintptr_t o_1;
  TCGTemp *local_48;
  TCGTemp *local_40;
  TCGTemp *local_38;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  uVar1 = ctx->opcode;
  uVar6 = (ulong)(uVar1 >> 0x1c);
  val = uVar1 >> 0xc & 0xf;
  len = uVar1 >> 0x10 & 0x1f;
  ofs = uVar1 >> 0x17 & 0x1f;
  uVar3 = uVar1 >> 0x15 & 3;
  if (uVar3 == 0) {
    if (ofs + len < 0x21) {
      pTVar4 = tcg_const_i32_tricore(tcg_ctx_00,val);
      tcg_gen_deposit_i32_tricore
                (tcg_ctx_00,tcg_ctx_00->cpu_gpr_d[uVar6],tcg_ctx_00->cpu_gpr_d[uVar1 >> 8 & 0xf],
                 pTVar4,ofs,len);
      tcg_temp_free_internal_tricore(tcg_ctx_00,(TCGTemp *)(pTVar4 + (long)tcg_ctx_00));
      return;
    }
  }
  else if (uVar3 == 1) {
    if ((uVar1 >> 0x1c & 1) != 0) {
      pTVar4 = tcg_const_i32_tricore(tcg_ctx_00,2);
      pTVar5 = tcg_const_i32_tricore(tcg_ctx_00,3);
      pTVar2 = ctx->uc->tcg_ctx;
      tcg_gen_op2_tricore(pTVar2,INDEX_op_movi_i32,(TCGArg)(pTVar2->cpu_PC + (long)pTVar2),
                          (long)(int)(ctx->base).pc_next);
      local_48 = (TCGTemp *)(tcg_ctx_00->cpu_env + (long)tcg_ctx_00);
      local_40 = (TCGTemp *)(pTVar4 + (long)tcg_ctx_00);
      local_38 = (TCGTemp *)(pTVar5 + (long)tcg_ctx_00);
      tcg_gen_callN_tricore(tcg_ctx_00,helper_raise_exception_sync,(TCGTemp *)0x0,3,&local_48);
      (ctx->base).is_jmp = DISAS_NORETURN;
      tcg_temp_free_internal_tricore(tcg_ctx_00,(TCGTemp *)(pTVar4 + (long)tcg_ctx_00));
      tcg_temp_free_internal_tricore(tcg_ctx_00,(TCGTemp *)(pTVar5 + (long)tcg_ctx_00));
    }
    if (ofs + len < 0x21) {
      tcg_gen_op2_tricore(tcg_ctx_00,INDEX_op_movi_i32,
                          (TCGArg)((long)&tcg_ctx_00->pool_cur +
                                  (long)tcg_ctx_00->cpu_gpr_d[uVar6 + 1]),
                          (long)(~(-1 << (sbyte)len) << (sbyte)ofs));
      tcg_gen_op2_tricore(tcg_ctx_00,INDEX_op_movi_i32,
                          (TCGArg)((long)&tcg_ctx_00->pool_cur + (long)tcg_ctx_00->cpu_gpr_d[uVar6])
                          ,(long)(int)(val << (sbyte)ofs));
    }
  }
  else {
    pTVar4 = tcg_const_i32_tricore(tcg_ctx_00,2);
    pTVar5 = tcg_const_i32_tricore(tcg_ctx_00,1);
    pTVar2 = ctx->uc->tcg_ctx;
    tcg_gen_op2_tricore(pTVar2,INDEX_op_movi_i32,(TCGArg)(pTVar2->cpu_PC + (long)pTVar2),
                        (long)(int)(ctx->base).pc_next);
    local_48 = (TCGTemp *)(tcg_ctx_00->cpu_env + (long)tcg_ctx_00);
    local_40 = (TCGTemp *)(pTVar4 + (long)tcg_ctx_00);
    local_38 = (TCGTemp *)(pTVar5 + (long)tcg_ctx_00);
    tcg_gen_callN_tricore(tcg_ctx_00,helper_raise_exception_sync,(TCGTemp *)0x0,3,&local_48);
    (ctx->base).is_jmp = DISAS_NORETURN;
    tcg_temp_free_internal_tricore(tcg_ctx_00,(TCGTemp *)(pTVar4 + (long)tcg_ctx_00));
    tcg_temp_free_internal_tricore(tcg_ctx_00,(TCGTemp *)(pTVar5 + (long)tcg_ctx_00));
  }
  return;
}

Assistant:

static void decode_rcpw_insert(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    uint32_t op2;
    int r1, r2;
    int32_t pos, width, const4;

    TCGv temp;

    op2    = MASK_OP_RCPW_OP2(ctx->opcode);
    r1     = MASK_OP_RCPW_S1(ctx->opcode);
    r2     = MASK_OP_RCPW_D(ctx->opcode);
    const4 = MASK_OP_RCPW_CONST4(ctx->opcode);
    width  = MASK_OP_RCPW_WIDTH(ctx->opcode);
    pos    = MASK_OP_RCPW_POS(ctx->opcode);

    switch (op2) {
    case OPC2_32_RCPW_IMASK:
        CHECK_REG_PAIR(r2);
        /* if pos + width > 32 undefined result */
        if (pos + width <= 32) {
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr_d[r2+1], ((1u << width) - 1) << pos);
            tcg_gen_movi_tl(tcg_ctx, tcg_ctx->cpu_gpr_d[r2], (const4 << pos));
        }
        break;
    case OPC2_32_RCPW_INSERT:
        /* if pos + width > 32 undefined result */
        if (pos + width <= 32) {
            temp = tcg_const_i32(tcg_ctx, const4);
            tcg_gen_deposit_tl(tcg_ctx, tcg_ctx->cpu_gpr_d[r2], tcg_ctx->cpu_gpr_d[r1], temp, pos, width);
            tcg_temp_free(tcg_ctx, temp);
        }
        break;
    default:
        generate_trap(ctx, TRAPC_INSN_ERR, TIN2_IOPC);
    }
}